

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O3

TValue * luaH_getint(Table *t,lua_Integer key)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  lua_Unsigned ui;
  Node *pNVar5;
  
  uVar4 = key - 1;
  uVar2 = t->alimit;
  if (uVar2 <= uVar4) {
    if (((-1 < (char)t->flags) ||
        (uVar3 = uVar2 - (uVar2 >> 1 & 0x55555555),
        uVar3 = (uVar3 >> 2 & 0x33333333) + (uVar3 & 0x33333333),
        ((uVar3 >> 4) + uVar3 & 0xf0f0f0f) * 0x1010101 >> 0x18 < 2)) ||
       (((ulong)(uVar2 + 1) != key && (uVar2 = luaH_realasize(t), uVar2 <= uVar4)))) {
      if ((ulong)key < 0x80000000) {
        uVar4 = (key & 0xffffffffU) % (ulong)(~(-1 << (t->lsizenode & 0x1f)) | 1);
      }
      else {
        uVar4 = (ulong)key % (ulong)(~(-1 << (t->lsizenode & 0x1f)) | 1);
      }
      pNVar5 = t->node + uVar4;
      while (((pNVar5->u).key_tt != '\x03' || ((pNVar5->u).key_val.gc != (GCObject *)key))) {
        piVar1 = &(pNVar5->u).next;
        pNVar5 = pNVar5 + *piVar1;
        if ((long)*piVar1 == 0) {
          return &absentkey;
        }
      }
      return (TValue *)pNVar5;
    }
    t->alimit = (uint)key;
  }
  return t->array + uVar4;
}

Assistant:

const TValue *luaH_getint (Table *t, lua_Integer key) {
  if (l_castS2U(key) - 1u < t->alimit)  /* 'key' in [1, t->alimit]? */
    return &t->array[key - 1];
  else if (!limitequalsasize(t) &&  /* key still may be in the array part? */
           (l_castS2U(key) == t->alimit + 1 ||
            l_castS2U(key) - 1u < luaH_realasize(t))) {
    t->alimit = cast_uint(key);  /* probably '#t' is here now */
    return &t->array[key - 1];
  }
  else {
    Node *n = hashint(t, key);
    for (;;) {  /* check whether 'key' is somewhere in the chain */
      if (keyisinteger(n) && keyival(n) == key)
        return gval(n);  /* that's it */
      else {
        int nx = gnext(n);
        if (nx == 0) break;
        n += nx;
      }
    }
    return &absentkey;
  }
}